

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolynomialBondType.hpp
# Opt level: O2

ostream * OpenMD::operator<<(ostream *os,PolynomialBondType *pbt)

{
  _Rb_tree_header *p_Var1;
  ostream *poVar2;
  _Base_ptr p_Var3;
  
  p_Var3 = (pbt->polynomial_).polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(pbt->polynomial_).polyPairMap_._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 == p_Var1) {
    poVar2 = std::operator<<(os,"This PolynomialBondType contains nothing");
  }
  else {
    poVar2 = std::operator<<(os,"This PolynomialBondType contains below terms:");
    std::endl<char,std::char_traits<char>>(poVar2);
    while( true ) {
      poVar2 = std::ostream::_M_insert<double>((double)p_Var3[1]._M_parent);
      poVar2 = std::operator<<(poVar2,"*");
      std::operator<<(poVar2,"(r - ");
      poVar2 = std::ostream::_M_insert<double>((pbt->super_BondType).r0);
      poVar2 = std::operator<<(poVar2,")");
      poVar2 = std::operator<<(poVar2,"^");
      std::ostream::operator<<(poVar2,p_Var3[1]._M_color);
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
      poVar2 = os;
      if ((_Rb_tree_header *)p_Var3 == p_Var1) break;
      std::operator<<(os," + ");
    }
  }
  std::endl<char,std::char_traits<char>>(poVar2);
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, PolynomialBondType& pbt) {
    DoublePolynomial::const_iterator i;

    i = pbt.polynomial_.begin();

    if (i == pbt.polynomial_.end()) {
      os << "This PolynomialBondType contains nothing" << std::endl;
      return os;
    }

    os << "This PolynomialBondType contains below terms:" << std::endl;

    while (true) {
      os << i->second << "*"
         << "(r - " << pbt.getEquilibriumBondLength() << ")"
         << "^" << i->first;

      if (++i == pbt.polynomial_.end()) {
        // If we reach the end of the polynomial pair, write out a
        // newline and then escape the loop
        os << std::endl;
        break;
      } else {
        // otherwise, write out a "+"
        os << " + ";
      }
    }

    return os;
  }